

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_arithmetic.h
# Opt level: O0

longdouble *
testinator::detail::Arbitrary_Arithmetic_Real<long_double>::generate
          (longdouble *__return_storage_ptr__,size_t generation,unsigned_long randomSeed)

{
  result_type_conflict9 *prVar1;
  TestRegistry *this;
  mt19937 *this_00;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__urng;
  longdouble in_ST0;
  longdouble in_ST1;
  undefined1 local_58 [8];
  uniform_real_distribution<long_double> dis;
  mt19937 *gen;
  unsigned_long randomSeed_local;
  size_t generation_local;
  
  if (__return_storage_ptr__ < (longdouble *)0x4) {
    prVar1 = (result_type_conflict9 *)
             ((long)&switchD_00215c63::switchdataD_00274d6c +
             (long)(int)(&switchD_00215c63::switchdataD_00274d6c)[(long)__return_storage_ptr__]);
    switch(__return_storage_ptr__) {
    case (longdouble *)0x0:
      break;
    case (longdouble *)0x1:
      prVar1 = (result_type_conflict9 *)::std::numeric_limits<long_double>::min();
      break;
    case (longdouble *)0x2:
      prVar1 = (result_type_conflict9 *)::std::numeric_limits<long_double>::max();
      break;
    case (longdouble *)0x3:
      prVar1 = (result_type_conflict9 *)::std::numeric_limits<long_double>::lowest();
    }
  }
  else {
    this = GetTestRegistry();
    this_00 = TestRegistry::RNG(this);
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(this_00,generation);
    ::std::numeric_limits<long_double>::min();
    ::std::numeric_limits<long_double>::max();
    ::std::uniform_real_distribution<long_double>::uniform_real_distribution
              ((uniform_real_distribution<long_double> *)local_58,in_ST0,in_ST1);
    prVar1 = ::std::uniform_real_distribution<long_double>::operator()
                       ((result_type_conflict9 *)local_58,
                        (uniform_real_distribution<long_double> *)this_00,__urng);
  }
  return (longdouble *)prVar1;
}

Assistant:

static T generate(std::size_t generation, unsigned long int randomSeed)
      {
        switch (generation)
        {
          case 0:
            return 0;
          case 1:
            return std::numeric_limits<T>::min();
          case 2:
            return std::numeric_limits<T>::max();
          case 3:
            return std::numeric_limits<T>::lowest();

          default:
          {
            std::mt19937& gen = testinator::GetTestRegistry().RNG();
            gen.seed(randomSeed);
            std::uniform_real_distribution<T> dis(
                std::numeric_limits<T>::min(), std::numeric_limits<T>::max());
            return dis(gen);
          }
        }
      }